

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab7.c
# Opt level: O3

int FeedFromArray(void)

{
  uint uVar1;
  int iVar2;
  FILE *__stream;
  long lVar3;
  long lVar4;
  long lVar5;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    puts("can\'t create in.txt. No space on disk?");
    iVar2 = -1;
  }
  else {
    lVar3 = (long)testN;
    if (-1 < testInOut[lVar3].N) {
      fprintf(__stream,"%d\n");
      lVar3 = (long)testN;
    }
    if (-1 < testInOut[lVar3].M) {
      fprintf(__stream,"%d\n");
      lVar3 = (long)testN;
      if (0 < testInOut[lVar3].M) {
        lVar4 = 0x10639c;
        lVar5 = 0;
        do {
          uVar1 = *(uint *)(lVar4 + -4 + lVar3 * 0xf0);
          if (uVar1 == 0) break;
          fprintf(__stream,"%d %d\n",(ulong)uVar1,(ulong)*(uint *)(lVar4 + lVar3 * 0xf0));
          lVar5 = lVar5 + 1;
          lVar3 = (long)testN;
          lVar4 = lVar4 + 8;
        } while (lVar5 < testInOut[lVar3].M);
      }
    }
    fclose(__stream);
    LabMemoryLimit = (long)testInOut[testN].N * 10 + (long)testInOut[testN].M * 2 + 0x400000;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int FeedFromArray(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    if (testInOut[testN].N >= 0) {
        fprintf(in, "%d\n", testInOut[testN].N);
    }
    if (testInOut[testN].M >= 0) {
        fprintf(in, "%d\n", testInOut[testN].M);
    }
    for (i = 0; i < testInOut[testN].M && testInOut[testN].G[i].a != 0; i++) {
        fprintf(in, "%d %d\n", testInOut[testN].G[i].a, testInOut[testN].G[i].b);
    }
    fclose(in);
    LabMemoryLimit = testInOut[testN].N * 10 + testInOut[testN].M * 2 + MIN_PROCESS_RSS_BYTES;
    return 0;
}